

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

int MatchFinder_Create(CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,
                      UInt32 matchMaxLen,UInt32 keepAddBufferAfter,ISzAlloc *alloc)

{
  Byte *pBVar1;
  CLzRef *pCVar2;
  sbyte sVar3;
  uint uVar4;
  UInt32 UVar5;
  uint uVar6;
  size_t sVar7;
  
  if (historySize < 0xe0000001) {
    sVar3 = 3;
    if (historySize < 0xc0000000) {
      sVar3 = 1 - (char)((int)historySize >> 0x1f);
    }
    UVar5 = keepAddBufferAfter + matchMaxLen;
    p->keepSizeBefore = keepAddBufferBefore + historySize + 1;
    p->keepSizeAfter = UVar5;
    uVar6 = (UVar5 + keepAddBufferBefore >> 1) +
            (historySize >> sVar3) + historySize + keepAddBufferBefore + UVar5 + 0x80001;
    if (p->directInput == '\0') {
      if ((p->bufferBase == (Byte *)0x0) || (p->blockSize != uVar6)) {
        (*alloc->Free)(alloc,p->bufferBase);
        p->bufferBase = (Byte *)0x0;
        p->blockSize = uVar6;
        pBVar1 = (Byte *)(*alloc->Alloc)(alloc,(ulong)uVar6);
        p->bufferBase = pBVar1;
      }
      if (p->bufferBase == (Byte *)0x0) goto LAB_0011210f;
    }
    else {
      p->blockSize = uVar6;
    }
    p->matchMaxLen = matchMaxLen;
    p->fixedHashSize = 0;
    uVar6 = p->numHashBytes;
    UVar5 = 0xffff;
    if ((uVar6 != 2) &&
       (uVar4 = historySize - 1 >> 1 | historySize - 1, uVar4 = uVar4 >> 2 | uVar4,
       uVar4 = uVar4 >> 4 | uVar4, uVar4 = uVar4 >> 1 | uVar4 >> 9 | 0xffff, UVar5 = uVar4,
       0x1000000 < uVar4)) {
      UVar5 = 0xffffff;
      if (uVar6 != 3) {
        UVar5 = uVar4 >> 1;
      }
    }
    p->hashMask = UVar5;
    if (2 < uVar6) {
      p->fixedHashSize = 0x400;
    }
    if (3 < uVar6) {
      p->fixedHashSize = p->fixedHashSize + 0x10000;
    }
    if (4 < uVar6) {
      p->fixedHashSize = p->fixedHashSize + 0x100000;
    }
    uVar6 = UVar5 + 1 + p->fixedHashSize;
    p->historySize = historySize;
    p->hashSizeSum = uVar6;
    p->cyclicBufferSize = historySize + 1;
    sVar7 = (ulong)uVar6 + ((ulong)(historySize + 1) << (p->btMode != '\0'));
    if ((p->hash != (CLzRef *)0x0) && (p->numRefs == sVar7)) {
      return 1;
    }
    (*alloc->Free)(alloc,p->hash);
    p->hash = (CLzRef *)0x0;
    p->numRefs = sVar7;
    pCVar2 = (CLzRef *)(*alloc->Alloc)(alloc,sVar7 * 4);
    p->hash = pCVar2;
    if (pCVar2 != (CLzRef *)0x0) {
      p->son = pCVar2 + p->hashSizeSum;
      return 1;
    }
  }
LAB_0011210f:
  (*alloc->Free)(alloc,p->hash);
  p->hash = (CLzRef *)0x0;
  if (p->directInput == '\0') {
    (*alloc->Free)(alloc,p->bufferBase);
    p->bufferBase = (Byte *)0x0;
  }
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder *p, UInt32 historySize,
    UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
    ISzAlloc *alloc)
{
  UInt32 sizeReserv;
  
  if (historySize > kMaxHistorySize)
  {
    MatchFinder_Free(p, alloc);
    return 0;
  }
  
  sizeReserv = historySize >> 1;
       if (historySize >= ((UInt32)3 << 30)) sizeReserv = historySize >> 3;
  else if (historySize >= ((UInt32)2 << 30)) sizeReserv = historySize >> 2;
  
  sizeReserv += (keepAddBufferBefore + matchMaxLen + keepAddBufferAfter) / 2 + (1 << 19);

  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  p->keepSizeAfter = matchMaxLen + keepAddBufferAfter;
  
  /* we need one additional byte, since we use MoveBlock after pos++ and before dictionary using */
  
  if (LzInWindow_Create(p, sizeReserv, alloc))
  {
    UInt32 newCyclicBufferSize = historySize + 1;
    UInt32 hs;
    p->matchMaxLen = matchMaxLen;
    {
      p->fixedHashSize = 0;
      if (p->numHashBytes == 2)
        hs = (1 << 16) - 1;
      else
      {
        hs = historySize - 1;
        hs |= (hs >> 1);
        hs |= (hs >> 2);
        hs |= (hs >> 4);
        hs |= (hs >> 8);
        hs >>= 1;
        hs |= 0xFFFF; /* don't change it! It's required for Deflate */
        if (hs > (1 << 24))
        {
          if (p->numHashBytes == 3)
            hs = (1 << 24) - 1;
          else
            hs >>= 1;
          /* if (bigHash) mode, GetHeads4b() in LzFindMt.c needs (hs >= ((1 << 24) - 1))) */
        }
      }
      p->hashMask = hs;
      hs++;
      if (p->numHashBytes > 2) p->fixedHashSize += kHash2Size;
      if (p->numHashBytes > 3) p->fixedHashSize += kHash3Size;
      if (p->numHashBytes > 4) p->fixedHashSize += kHash4Size;
      hs += p->fixedHashSize;
    }

    {
      size_t newSize;
      size_t numSons;
      p->historySize = historySize;
      p->hashSizeSum = hs;
      p->cyclicBufferSize = newCyclicBufferSize;
      
      numSons = newCyclicBufferSize;
      if (p->btMode)
        numSons <<= 1;
      newSize = hs + numSons;

      if (p->hash && p->numRefs == newSize)
        return 1;
      
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->numRefs = newSize;
      p->hash = AllocRefs(newSize, alloc);
      
      if (p->hash)
      {
        p->son = p->hash + p->hashSizeSum;
        return 1;
      }
    }
  }

  MatchFinder_Free(p, alloc);
  return 0;
}